

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::qualitystatistics(tetgenmesh *this)

{
  int iVar1;
  memorypool *pmVar2;
  void **ppvVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  double dVar7;
  double dVar8;
  undefined4 uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  point p3;
  bool bVar13;
  tetrahedron *pppdVar14;
  double *pdVar15;
  long lVar16;
  size_t sVar17;
  int iVar18;
  ulong uVar19;
  ulong uVar20;
  char *pcVar21;
  tetgenmesh *this_00;
  long *plVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double __x;
  double dVar31;
  double dVar32;
  double dVar33;
  double rhs [4];
  double N [4] [3];
  double alldihed [6];
  double faceangle [3];
  double aspectratiotable [12];
  int indx [4];
  double H [4];
  double radiusratiotable [12];
  double D;
  unsigned_long aspecttable [16];
  double edgelength [6];
  unsigned_long radiustable [12];
  double V [6] [3];
  unsigned_long dihedangletable [18];
  char sbuf [128];
  double A [4] [4];
  unsigned_long faceangletable [18];
  double local_678;
  double local_670;
  double local_640;
  double local_638;
  double local_630;
  double local_628;
  double local_5f0;
  double local_5e8 [4];
  double local_5c8 [12];
  double adStack_568 [6];
  double local_538 [4];
  tetrahedron local_518 [3];
  point local_500;
  double local_4f8 [12];
  int local_498 [4];
  double local_488 [4];
  double local_468 [13];
  double local_400;
  long local_3f8 [16];
  double local_378 [5];
  long alStack_350 [13];
  double local_2e8 [6];
  double adStack_2b8 [3];
  double adStack_2a0 [3];
  double adStack_288 [3];
  double adStack_270 [3];
  long local_258 [7];
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  undefined8 local_208;
  long local_200 [5];
  undefined8 local_1d8;
  undefined8 local_1d0;
  char local_1c8 [8];
  undefined1 local_1c0;
  double local_148 [16];
  long local_c8 [9];
  long local_80 [10];
  
  puts("Mesh quality statistics:\n");
  local_468[0] = 0.707;
  local_468[1] = 1.0;
  local_468[2] = 1.1;
  local_468[3] = 1.2;
  local_468[4] = 1.4;
  local_468[5] = 1.6;
  local_468[6] = 1.8;
  local_468[7] = 2.0;
  local_468[8] = 2.5;
  local_468[9] = 3.0;
  local_468[10] = 10.0;
  local_468[0xb] = 0.0;
  local_4f8[0] = 1.5;
  local_4f8[1] = 2.0;
  local_4f8[2] = 2.5;
  local_4f8[3] = 3.0;
  local_4f8[4] = 4.0;
  local_4f8[5] = 6.0;
  local_4f8[6] = 10.0;
  local_4f8[7] = 15.0;
  local_4f8[8] = 25.0;
  local_4f8[9] = 50.0;
  local_4f8[10] = 100.0;
  local_4f8[0xb] = 0.0;
  alStack_350[0xb] = 0;
  alStack_350[0xc] = 0;
  alStack_350[9] = 0;
  alStack_350[10] = 0;
  alStack_350[7] = 0;
  alStack_350[8] = 0;
  alStack_350[5] = 0;
  alStack_350[6] = 0;
  alStack_350[3] = 0;
  alStack_350[4] = 0;
  alStack_350[1] = 0;
  alStack_350[2] = 0;
  local_3f8[0] = 0;
  local_3f8[1] = 0;
  local_3f8[2] = 0;
  local_3f8[3] = 0;
  local_3f8[4] = 0;
  local_3f8[5] = 0;
  local_3f8[6] = 0;
  local_3f8[7] = 0;
  local_3f8[8] = 0;
  local_3f8[9] = 0;
  local_3f8[10] = 0;
  local_3f8[0xb] = 0;
  memset(local_258,0,0x90);
  plVar22 = local_c8;
  memset(plVar22,0,0x90);
  dVar7 = ((((this->xmax - this->xmin) + this->ymax) - this->ymin) + this->zmax) - this->zmin;
  dVar7 = dVar7 * dVar7;
  iVar1 = this->numelemattrib;
  pmVar2 = this->tetrahedrons;
  ppvVar3 = pmVar2->firstblock;
  pmVar2->pathblock = ppvVar3;
  pmVar2->pathitem =
       (void *)((long)ppvVar3 +
               (((long)pmVar2->alignbytes + 8U) -
               (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
  pmVar2->pathitemsleft = pmVar2->itemsperblock;
  this_00 = this;
  pppdVar14 = tetrahedrontraverse(this);
  local_638 = dVar7;
  if (pppdVar14 == (tetrahedron *)0x0) {
    dVar29 = 0.0;
    dVar33 = 1e+16;
    local_670 = 0.0;
    dVar24 = 0.0;
    local_628 = 0.0;
    dVar30 = 0.0;
    dVar31 = 0.0;
    local_678 = 0.0;
    dVar26 = dVar7;
  }
  else {
    local_678 = 0.0;
    dVar24 = 0.0;
    local_640 = 0.0;
    __x = 0.0;
    dVar31 = 0.0;
    dVar30 = 0.0;
    dVar29 = 180.0;
    local_628 = 180.0;
    local_630 = 0.0;
    dVar32 = 1e+16;
    dVar25 = dVar7;
LAB_00152d3c:
    do {
      if (((this->b->convex == 0) ||
          ((double)pppdVar14[(long)this->elemattribindex + (long)iVar1 + -1] != -1.0)) ||
         (NAN((double)pppdVar14[(long)this->elemattribindex + (long)iVar1 + -1]))) {
        lVar23 = 0;
        do {
          local_518[lVar23] = pppdVar14[lVar23 + 4];
          p3 = local_500;
          ppdVar6 = local_518[2];
          ppdVar5 = local_518[1];
          ppdVar4 = local_518[0];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        dVar33 = orient3dfast(this_00,(double *)local_518[1],(double *)local_518[0],
                              (double *)local_518[2],local_500);
        dVar33 = dVar33 / 6.0;
        tetprismvol(this_00,(double *)ppdVar4,(double *)ppdVar5,(double *)ppdVar6,p3);
        lVar23 = 0;
        do {
          local_2e8[lVar23] = (double)ppdVar4[lVar23] - p3[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
        dVar26 = dVar33;
        if (dVar25 <= dVar33) {
          dVar26 = dVar25;
        }
        lVar23 = 0;
        do {
          local_2e8[lVar23 + 3] = (double)ppdVar5[lVar23] - p3[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
        lVar23 = 0;
        do {
          local_2e8[lVar23 + 6] = (double)ppdVar6[lVar23] - p3[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
        lVar23 = 0;
        do {
          local_2e8[lVar23 + 9] = (double)ppdVar5[lVar23] - (double)ppdVar4[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
        lVar23 = 0;
        do {
          local_2e8[lVar23 + 0xc] = (double)ppdVar6[lVar23] - (double)ppdVar5[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
        lVar23 = 0;
        do {
          local_2e8[lVar23 + 0xf] = (double)ppdVar4[lVar23] - (double)ppdVar6[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 != 3);
        pdVar15 = local_2e8 + 2;
        lVar23 = 0;
        do {
          local_378[lVar23] =
               *pdVar15 * *pdVar15 + pdVar15[-2] * pdVar15[-2] + pdVar15[-1] * pdVar15[-1];
          lVar23 = lVar23 + 1;
          pdVar15 = pdVar15 + 3;
        } while (lVar23 != 6);
        lVar23 = 0;
        do {
          dVar25 = local_378[0];
          dVar28 = local_378[0];
          if (lVar23 != 0) {
            dVar25 = local_378[lVar23];
            dVar28 = dVar25;
            if (__x <= dVar25) {
              dVar28 = __x;
            }
            if (dVar25 <= local_640) {
              dVar25 = local_640;
            }
          }
          __x = dVar28;
          local_640 = dVar25;
          dVar25 = local_378[lVar23];
          dVar28 = dVar25;
          if (dVar25 <= local_678) {
            dVar28 = local_678;
          }
          local_678 = dVar28;
          if (local_638 <= dVar25) {
            dVar25 = local_638;
          }
          local_638 = dVar25;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 6);
        lVar23 = 0;
        pdVar15 = local_2e8;
        do {
          *(double *)((long)local_148 + lVar23 + 0x10) = pdVar15[2];
          dVar25 = pdVar15[1];
          *(double *)((long)local_148 + lVar23) = *pdVar15;
          *(double *)((long)local_148 + lVar23 + 8) = dVar25;
          pdVar15 = pdVar15 + 3;
          lVar23 = lVar23 + 0x20;
        } while (lVar23 != 0x60);
        dVar25 = dVar33;
        if (dVar33 <= dVar31) {
          dVar25 = dVar31;
        }
        dVar31 = dVar25;
        bVar13 = lu_decmp(this_00,(double (*) [4])local_148,3,local_498,&local_400,0);
        dVar25 = dVar26;
        if (bVar13) {
          pdVar15 = local_5c8;
          lVar23 = 0;
          do {
            local_5e8[0] = 0.0;
            local_5e8[1] = 0.0;
            local_5e8[2] = 0.0;
            local_5e8[lVar23] = 1.0;
            lu_solve(this_00,(double (*) [4])local_148,3,local_498,local_5e8,0);
            pdVar15[2] = local_5e8[2];
            *pdVar15 = local_5e8[0];
            pdVar15[1] = local_5e8[1];
            lVar23 = lVar23 + 1;
            pdVar15 = pdVar15 + 3;
          } while (lVar23 != 3);
          lVar23 = -3;
          do {
            local_5c8[lVar23 + 0xc] =
                 (-local_5c8[lVar23 + 3] - local_5c8[lVar23 + 6]) - local_5c8[lVar23 + 9];
            lVar23 = lVar23 + 1;
          } while (lVar23 != 0);
          pdVar15 = local_2e8 + 2;
          lVar23 = 0;
          do {
            local_5e8[lVar23] =
                 (*pdVar15 * *pdVar15 + pdVar15[-2] * pdVar15[-2] + pdVar15[-1] * pdVar15[-1]) * 0.5
            ;
            lVar23 = lVar23 + 1;
            pdVar15 = pdVar15 + 3;
          } while (lVar23 != 3);
          lu_solve(this_00,(double (*) [4])local_148,3,local_498,local_5e8,0);
          local_5f0 = local_5e8[2] * local_5e8[2] +
                      local_5e8[0] * local_5e8[0] + local_5e8[1] * local_5e8[1];
          if (local_5f0 < 0.0) {
            local_5f0 = sqrt(local_5f0);
          }
          else {
            local_5f0 = SQRT(local_5f0);
          }
          pdVar15 = local_5c8;
          lVar23 = 0;
          do {
            dVar33 = local_5c8[lVar23 * 3 + 2] * local_5c8[lVar23 * 3 + 2] +
                     local_5c8[lVar23 * 3] * local_5c8[lVar23 * 3] +
                     local_5c8[lVar23 * 3 + 1] * local_5c8[lVar23 * 3 + 1];
            if (dVar33 < 0.0) {
              dVar33 = sqrt(dVar33);
            }
            else {
              dVar33 = SQRT(dVar33);
            }
            local_488[lVar23] = dVar33;
            lVar16 = 0;
            do {
              pdVar15[lVar16] = pdVar15[lVar16] / dVar33;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            lVar23 = lVar23 + 1;
            pdVar15 = pdVar15 + 3;
          } while (lVar23 != 4);
          lVar23 = 1;
          dVar33 = local_488[0];
          do {
            local_670 = local_488[lVar23];
            if (local_488[lVar23] <= dVar33) {
              local_670 = dVar33;
            }
            lVar23 = lVar23 + 1;
            dVar33 = local_670;
          } while (lVar23 != 4);
        }
        else {
          if (dVar33 <= 0.0) {
            pcVar21 = "degenerated";
            if (dVar33 < 0.0) {
              pcVar21 = "inverted";
            }
            lVar23 = (long)this->pointmarkindex;
            printf("  !! Warning:  A %s tet (%d,%d,%d,%d).\n",pcVar21,
                   (ulong)*(uint *)((long)ppdVar4 + lVar23 * 4),
                   (ulong)*(uint *)((long)ppdVar5 + lVar23 * 4),
                   (ulong)*(uint *)((long)ppdVar6 + lVar23 * 4));
            this_00 = this;
            pppdVar14 = tetrahedrontraverse(this);
            if (pppdVar14 == (tetrahedron *)0x0) break;
            goto LAB_00152d3c;
          }
          facenormal(this_00,(point)ppdVar6,(point)ppdVar5,p3,local_5c8,1,(double *)0x0);
          facenormal(this_00,(point)ppdVar4,(point)ppdVar6,p3,local_5c8 + 3,1,(double *)0x0);
          facenormal(this_00,(point)ppdVar5,(point)ppdVar4,p3,local_5c8 + 6,1,(double *)0x0);
          facenormal(this_00,(point)ppdVar4,(point)ppdVar5,(point)ppdVar6,local_5c8 + 9,1,
                     (double *)0x0);
          pdVar15 = local_5c8;
          lVar23 = 0;
          do {
            dVar28 = local_5c8[lVar23 * 3 + 2] * local_5c8[lVar23 * 3 + 2] +
                     local_5c8[lVar23 * 3] * local_5c8[lVar23 * 3] +
                     local_5c8[lVar23 * 3 + 1] * local_5c8[lVar23 * 3 + 1];
            if (dVar28 < 0.0) {
              dVar28 = sqrt(dVar28);
            }
            else {
              dVar28 = SQRT(dVar28);
            }
            local_488[lVar23] = dVar28;
            lVar16 = 0;
            do {
              pdVar15[lVar16] = pdVar15[lVar16] / dVar28;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            lVar23 = lVar23 + 1;
            pdVar15 = pdVar15 + 3;
          } while (lVar23 != 4);
          lVar23 = 1;
          dVar28 = local_488[0] / dVar33;
          do {
            local_670 = local_488[lVar23] / dVar33;
            if (local_488[lVar23] / dVar33 <= dVar28) {
              local_670 = dVar28;
            }
            lVar23 = lVar23 + 1;
            dVar28 = local_670;
          } while (lVar23 != 4);
          if (local_640 < 0.0) {
            local_5f0 = sqrt(local_640);
          }
          else {
            local_5f0 = SQRT(local_640);
          }
          local_5f0 = local_5f0 * 0.5;
        }
        dVar10 = local_5c8[2];
        dVar28 = local_5c8[1];
        dVar33 = local_5c8[0];
        pdVar15 = local_5c8 + 5;
        lVar23 = 0;
        do {
          dVar8 = *pdVar15 * dVar10 + pdVar15[-2] * dVar33 + pdVar15[-1] * dVar28;
          local_5c8[lVar23 + 0xc] = -dVar8;
          dVar27 = -1.0;
          if ((1.0 < dVar8) || (dVar27 = 1.0, dVar8 < -1.0)) {
            local_5c8[lVar23 + 0xc] = dVar27;
          }
          dVar8 = acos(local_5c8[lVar23 + 0xc]);
          dVar12 = local_5c8[5];
          dVar11 = local_5c8[4];
          dVar27 = local_5c8[3];
          local_5c8[lVar23 + 0xc] = (dVar8 / PI) * 180.0;
          lVar23 = lVar23 + 1;
          pdVar15 = pdVar15 + 3;
        } while (lVar23 != 3);
        lVar23 = 0;
        pdVar15 = local_5c8 + 8;
        do {
          dVar33 = *pdVar15 * dVar12 + pdVar15[-2] * dVar27 + pdVar15[-1] * dVar11;
          local_5c8[lVar23 + 0xf] = -dVar33;
          dVar28 = -1.0;
          if ((1.0 < dVar33) || (dVar28 = 1.0, dVar33 < -1.0)) {
            local_5c8[lVar23 + 0xf] = dVar28;
          }
          dVar33 = acos(local_5c8[lVar23 + 0xf]);
          local_5c8[lVar23 + 0xf] = (dVar33 / PI) * 180.0;
          pdVar15 = pdVar15 + 3;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 2);
        dVar33 = local_5c8[8] * local_5c8[0xb] +
                 local_5c8[6] * local_5c8[9] + local_5c8[7] * local_5c8[10];
        dVar28 = -1.0;
        if ((1.0 < dVar33) || (dVar28 = 1.0, adStack_568[5] = -dVar33, dVar33 < -1.0)) {
          adStack_568[5] = dVar28;
        }
        dVar33 = acos(adStack_568[5]);
        adStack_568[5] = (dVar33 / PI) * 180.0;
        lVar23 = 0;
        dVar33 = dVar24;
        dVar28 = local_628;
        do {
          dVar24 = local_5c8[lVar23 + 0xc];
          iVar18 = 0;
          if ((((5.0 <= dVar24) && ((dVar24 < 5.0 || (iVar18 = 1, 10.0 <= dVar24)))) &&
              ((dVar24 < 80.0 || (iVar18 = 9, 110.0 <= dVar24)))) &&
             (((dVar24 < 170.0 || (iVar18 = 0x10, 175.0 <= dVar24)) &&
              (iVar18 = 0x11, dVar24 < 175.0)))) {
            if (80.0 <= dVar24) {
              iVar18 = (int)(dVar24 / 10.0) + -1;
            }
            else {
              iVar18 = (int)(dVar24 / 10.0) + 1;
            }
          }
          local_258[iVar18] = local_258[iVar18] + 1;
          local_628 = dVar24;
          if (dVar28 <= dVar24) {
            local_628 = dVar28;
          }
          if (dVar24 <= dVar33) {
            dVar24 = dVar33;
          }
          lVar23 = lVar23 + 1;
          dVar33 = dVar24;
          dVar28 = local_628;
        } while (lVar23 != 6);
        lVar23 = 0;
        do {
          if ((((tetrahedron *)((ulong)pppdVar14[lVar23] & 0xfffffffffffffff0))[7] ==
               (tetrahedron)this->dummypoint) ||
             (pppdVar14 < (tetrahedron *)((ulong)pppdVar14[lVar23] & 0xfffffffffffffff0))) {
            ppdVar4 = pppdVar14[orgpivot[lVar23]];
            ppdVar5 = pppdVar14[destpivot[lVar23]];
            ppdVar6 = pppdVar14[apexpivot[lVar23]];
            local_518[0] = ppdVar4;
            local_518[1] = ppdVar5;
            local_518[2] = ppdVar6;
            dVar33 = interiorangle(this_00,(double *)ppdVar4,(double *)ppdVar5,(double *)ppdVar6,
                                   (double *)0x0);
            local_538[0] = dVar33;
            local_538[1] = interiorangle(this_00,(double *)ppdVar5,(double *)ppdVar6,
                                         (double *)ppdVar4,(double *)0x0);
            local_538[2] = PI - (dVar33 + local_538[1]);
            lVar16 = 0;
            do {
              local_5c8[lVar16 + 0x12] = (local_5c8[lVar16 + 0x12] * 180.0) / PI;
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            lVar16 = 0;
            dVar33 = dVar30;
            do {
              dVar28 = local_5c8[lVar16 + 0x12];
              dVar30 = dVar28;
              if (dVar29 <= dVar28) {
                dVar30 = dVar29;
              }
              dVar29 = dVar30;
              dVar30 = dVar28;
              if (dVar28 <= dVar33) {
                dVar30 = dVar33;
              }
              local_c8[(int)(dVar28 / 10.0)] = local_c8[(int)(dVar28 / 10.0)] + 1;
              lVar16 = lVar16 + 1;
              dVar33 = dVar30;
            } while (lVar16 != 3);
          }
          lVar23 = lVar23 + 1;
        } while (lVar23 != 4);
        if (__x < 0.0) {
          dVar28 = sqrt(__x);
        }
        else {
          dVar28 = SQRT(__x);
        }
        if (local_640 < 0.0) {
          dVar33 = sqrt(local_640);
        }
        else {
          dVar33 = SQRT(local_640);
        }
        local_670 = local_670 * dVar33;
        uVar20 = 0;
        do {
          uVar19 = uVar20;
          if (10 < uVar19) break;
          uVar20 = uVar19 + 1;
        } while (local_4f8[uVar19] <= local_670 && local_670 != local_4f8[uVar19]);
        dVar33 = local_670;
        if (dVar32 <= local_670) {
          dVar33 = dVar32;
        }
        local_3f8[uVar19] = local_3f8[uVar19] + 1;
        uVar20 = 0;
        do {
          uVar19 = uVar20 + 1;
          if (10 < uVar20) break;
          pdVar15 = local_468 + uVar20;
          uVar20 = uVar19;
        } while (*pdVar15 <= local_5f0 / dVar28 && local_5f0 / dVar28 != *pdVar15);
        if (local_670 <= local_630) {
          local_670 = local_630;
        }
        alStack_350[uVar19] = alStack_350[uVar19] + 1;
        this_00 = this;
        pppdVar14 = tetrahedrontraverse(this);
        dVar32 = dVar33;
        local_630 = local_670;
        if (pppdVar14 == (tetrahedron *)0x0) goto LAB_00153b1a;
        goto LAB_00152d3c;
      }
      this_00 = this;
      pppdVar14 = tetrahedrontraverse(this);
      dVar26 = dVar25;
    } while (pppdVar14 != (tetrahedron *)0x0);
    local_670 = local_630;
    dVar33 = dVar32;
  }
LAB_00153b1a:
  if (local_638 < 0.0) {
    dVar32 = sqrt(local_638);
    uVar9 = SUB84(dVar32,0);
  }
  else {
    uVar9 = SUB84(SQRT(local_638),0);
  }
  if (local_678 < 0.0) {
    local_678 = sqrt(local_678);
  }
  else {
    local_678 = SQRT(local_678);
  }
  if (dVar7 < 0.0) {
    sqrt(dVar7);
  }
  printf("  Smallest volume: %16.5g   |  Largest volume: %16.5g\n",SUB84(dVar26,0),dVar31);
  printf("  Shortest edge:   %16.5g   |  Longest edge:   %16.5g\n",uVar9,local_678);
  printf("  Smallest asp.ratio: %13.5g   |  Largest asp.ratio: %13.5g\n",SUB84(dVar33,0),local_670);
  sprintf(local_1c8,"%.17g",SUB84(dVar30,0));
  sVar17 = strlen(local_1c8);
  if (8 < sVar17) {
    local_1c0 = 0;
  }
  printf("  Smallest facangle: %14.5g   |  Largest facangle:       %s\n",SUB84(dVar29,0),local_1c8);
  sprintf(local_1c8,"%.17g",SUB84(dVar24,0));
  sVar17 = strlen(local_1c8);
  if (8 < sVar17) {
    local_1c0 = 0;
  }
  printf("  Smallest dihedral: %14.5g   |  Largest dihedral:       %s\n\n",SUB84(local_628,0),
         local_1c8);
  puts("  Aspect ratio histogram:");
  dVar7 = local_4f8[5];
  printf("         < %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",SUB84(local_4f8[0],0),
         local_4f8[5],local_4f8[6],local_3f8[0],local_3f8[6]);
  lVar23 = 1;
  do {
    printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
           SUB84(local_4f8[lVar23 + -1],0),local_4f8[lVar23],local_4f8[lVar23 + 5],
           local_4f8[lVar23 + 6],local_3f8[lVar23],local_3f8[lVar23 + 6]);
    lVar23 = lVar23 + 1;
  } while (lVar23 != 5);
  printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g -            :  %8ld\n",SUB84(local_4f8[4],0),
         dVar7,local_4f8[10],local_3f8[5],local_3f8[0xb]);
  printf("  (A tetrahedron\'s aspect ratio is its longest edge length");
  puts(" divided by its");
  puts("    smallest side height)\n");
  puts("  Face angle histogram:");
  uVar20 = 0;
  do {
    uVar19 = uVar20 + 10;
    printf("    %3d - %3d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",uVar20,
           uVar19 & 0xffffffff,*plVar22,(ulong)((int)uVar20 + 0x5a),(ulong)((int)uVar20 + 100),
           plVar22[9]);
    plVar22 = plVar22 + 1;
    uVar20 = uVar19;
  } while (uVar19 != 0x5a);
  dVar7 = this->minfaceang;
  if ((dVar7 != PI) || (NAN(dVar7) || NAN(PI))) {
    printf("  Minimum input face angle is %g (degree).\n",SUB84((dVar7 / PI) * 180.0,0));
  }
  putchar(10);
  puts("  Dihedral angle histogram:");
  plVar22 = local_258 + 2;
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0,5,local_258[0],0x50,
         0x6e,local_210);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",5,10,local_258[1],0x6e
         ,0x78,local_208);
  lVar23 = -0x32;
  do {
    iVar1 = (int)lVar23;
    printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           (ulong)(iVar1 + 0x3c),(ulong)(iVar1 + 0x46),*plVar22,(ulong)(iVar1 + 0xaa),
           (ulong)(iVar1 + 0xb4),plVar22[9]);
    plVar22 = plVar22 + 1;
    lVar23 = lVar23 + 10;
  } while (lVar23 != 0);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0x3c,0x46,local_220,
         0xaa,0xaf,local_1d8);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",0x46,0x50,local_218,
         0xaf,0xb4,local_1d0);
  dVar7 = this->minfacetdihed;
  if ((dVar7 != PI) || (NAN(dVar7) || NAN(PI))) {
    printf("  Minimum input dihedral angle is %g (degree).\n",SUB84((dVar7 / PI) * 180.0,0));
  }
  putchar(10);
  putchar(10);
  return;
}

Assistant:

void tetgenmesh::qualitystatistics()
{
  triface tetloop, neightet;
  point p[4];
  char sbuf[128];
  REAL radiusratiotable[12];
  REAL aspectratiotable[12];
  REAL A[4][4], rhs[4], D;
  REAL V[6][3], N[4][3], H[4]; // edge-vectors, face-normals, face-heights.
  REAL edgelength[6], alldihed[6], faceangle[3];
  REAL shortest, longest;
  REAL smallestvolume, biggestvolume;
  REAL smallestratio, biggestratio;
  REAL smallestdiangle, biggestdiangle;
  REAL smallestfaangle, biggestfaangle;
  REAL total_tet_vol, total_tetprism_vol;
  REAL tetvol, minaltitude;
  REAL cirradius, minheightinv; // insradius;
  REAL shortlen, longlen;
  REAL tetaspect, tetradius;
  REAL smalldiangle, bigdiangle;
  REAL smallfaangle, bigfaangle;
  unsigned long radiustable[12];
  unsigned long aspecttable[16];
  unsigned long dihedangletable[18];
  unsigned long faceangletable[18];
  int indx[4];
  int radiusindex;
  int aspectindex;
  int tendegree;
  int i, j;

  printf("Mesh quality statistics:\n\n");

  shortlen = longlen = 0.0;
  smalldiangle = bigdiangle = 0.0;
  total_tet_vol = 0.0;
  total_tetprism_vol = 0.0;

  radiusratiotable[0]  =    0.707;    radiusratiotable[1]  =     1.0;
  radiusratiotable[2]  =      1.1;    radiusratiotable[3]  =     1.2;
  radiusratiotable[4]  =      1.4;    radiusratiotable[5]  =     1.6;
  radiusratiotable[6]  =      1.8;    radiusratiotable[7]  =     2.0;
  radiusratiotable[8]  =      2.5;    radiusratiotable[9]  =     3.0;
  radiusratiotable[10] =     10.0;    radiusratiotable[11] =     0.0;

  aspectratiotable[0]  =      1.5;    aspectratiotable[1]  =     2.0;
  aspectratiotable[2]  =      2.5;    aspectratiotable[3]  =     3.0;
  aspectratiotable[4]  =      4.0;    aspectratiotable[5]  =     6.0;
  aspectratiotable[6]  =     10.0;    aspectratiotable[7]  =    15.0;
  aspectratiotable[8]  =     25.0;    aspectratiotable[9]  =    50.0;
  aspectratiotable[10] =    100.0;    aspectratiotable[11] =     0.0;
  
  for (i = 0; i < 12; i++) radiustable[i] = 0l;
  for (i = 0; i < 12; i++) aspecttable[i] = 0l;
  for (i = 0; i < 18; i++) dihedangletable[i] = 0l;
  for (i = 0; i < 18; i++) faceangletable[i] = 0l;

  minaltitude = xmax - xmin + ymax - ymin + zmax - zmin;
  minaltitude = minaltitude * minaltitude;
  shortest = minaltitude;
  longest = 0.0;
  smallestvolume = minaltitude;
  biggestvolume = 0.0;
  smallestratio = 1e+16; // minaltitude;
  biggestratio = 0.0;
  smallestdiangle = smallestfaangle = 180.0;
  biggestdiangle = biggestfaangle = 0.0;


  int attrnum = numelemattrib - 1;

  // Loop all elements, calculate quality parameters for each element.
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != (tetrahedron *) NULL) {

    if (b->convex) {
      // Skip tets in the exterior.
      if (elemattribute(tetloop.tet, attrnum) == -1.0) {
        tetloop.tet = tetrahedrontraverse();
        continue;
      }
    }

    // Get four vertices: p0, p1, p2, p3.
    for (i = 0; i < 4; i++) p[i] = (point) tetloop.tet[4 + i];

    // Get the tet volume.
    tetvol = orient3dfast(p[1], p[0], p[2], p[3]) / 6.0;
    total_tet_vol += tetvol;
    total_tetprism_vol += tetprismvol(p[0], p[1], p[2], p[3]);

    // Calculate the largest and smallest volume.
    if (tetvol < smallestvolume) {
      smallestvolume = tetvol;
    } 
    if (tetvol > biggestvolume) {
      biggestvolume = tetvol;
    }

    // Set the edge vectors: V[0], ..., V[5]
    for (i = 0; i < 3; i++) V[0][i] = p[0][i] - p[3][i]; // V[0]: p3->p0.
    for (i = 0; i < 3; i++) V[1][i] = p[1][i] - p[3][i]; // V[1]: p3->p1.
    for (i = 0; i < 3; i++) V[2][i] = p[2][i] - p[3][i]; // V[2]: p3->p2.
    for (i = 0; i < 3; i++) V[3][i] = p[1][i] - p[0][i]; // V[3]: p0->p1.
    for (i = 0; i < 3; i++) V[4][i] = p[2][i] - p[1][i]; // V[4]: p1->p2.
    for (i = 0; i < 3; i++) V[5][i] = p[0][i] - p[2][i]; // V[5]: p2->p0.

    // Get the squares of the edge lengths.
    for (i = 0; i < 6; i++) edgelength[i] = dot(V[i], V[i]);

    // Calculate the longest and shortest edge length.
    for (i = 0; i < 6; i++) {
      if (i == 0) {
        shortlen = longlen = edgelength[i];
      } else {
        shortlen = edgelength[i] < shortlen ? edgelength[i] : shortlen;
        longlen  = edgelength[i] > longlen  ? edgelength[i] : longlen;
      }
      if (edgelength[i] > longest) {
        longest = edgelength[i];
      } 
      if (edgelength[i] < shortest) {
        shortest = edgelength[i];
      }
    }

    // Set the matrix A = [V[0], V[1], V[2]]^T.
    for (j = 0; j < 3; j++) {
      for (i = 0; i < 3; i++) A[j][i] = V[j][i];
    }

    // Decompose A just once.
    if (lu_decmp(A, 3, indx, &D, 0)) {   
      // Get the three faces normals.
      for (j = 0; j < 3; j++) {
        for (i = 0; i < 3; i++) rhs[i] = 0.0;
        rhs[j] = 1.0;  // Positive means the inside direction
        lu_solve(A, 3, indx, rhs, 0);
        for (i = 0; i < 3; i++) N[j][i] = rhs[i];
      }
      // Get the fourth face normal by summing up the first three.
      for (i = 0; i < 3; i++) N[3][i] = - N[0][i] - N[1][i] - N[2][i];
      // Get the radius of the circumsphere.
      for (i = 0; i < 3; i++) rhs[i] = 0.5 * dot(V[i], V[i]);
      lu_solve(A, 3, indx, rhs, 0);
      cirradius = sqrt(dot(rhs, rhs));
      // Normalize the face normals.
      for (i = 0; i < 4; i++) {
        // H[i] is the inverse of height of its corresponding face.
        H[i] = sqrt(dot(N[i], N[i]));
        for (j = 0; j < 3; j++) N[i][j] /= H[i];
      }
      // Get the radius of the inscribed sphere.
      // insradius = 1.0 / (H[0] + H[1] + H[2] + H[3]);
      // Get the biggest H[i] (corresponding to the smallest height).
      minheightinv = H[0];
      for (i = 1; i < 4; i++) {
        if (H[i] > minheightinv) minheightinv = H[i];
      }
    } else {
      // A nearly degenerated tet.
      if (tetvol <= 0.0) {
        printf("  !! Warning:  A %s tet (%d,%d,%d,%d).\n", 
               tetvol < 0 ? "inverted" : "degenerated", pointmark(p[0]),
               pointmark(p[1]), pointmark(p[2]), pointmark(p[3]));
        // Skip it.        
        tetloop.tet = tetrahedrontraverse();
        continue;
      }
      // Calculate the four face normals.
      facenormal(p[2], p[1], p[3], N[0], 1, NULL);
      facenormal(p[0], p[2], p[3], N[1], 1, NULL);
      facenormal(p[1], p[0], p[3], N[2], 1, NULL);
      facenormal(p[0], p[1], p[2], N[3], 1, NULL);
      // Normalize the face normals.
      for (i = 0; i < 4; i++) {
        // H[i] is the twice of the area of the face.
        H[i] = sqrt(dot(N[i], N[i]));
        for (j = 0; j < 3; j++) N[i][j] /= H[i];
      }
      // Get the biggest H[i] / tetvol (corresponding to the smallest height).
      minheightinv = (H[0] / tetvol);
      for (i = 1; i < 4; i++) {
        if ((H[i] / tetvol) > minheightinv) minheightinv = (H[i] / tetvol);
      }
      // Let the circumradius to be the half of its longest edge length.
      cirradius = 0.5 * sqrt(longlen);
    }

    // Get the dihedrals (in degree) at each edges.
    j = 0;
    for (i = 1; i < 4; i++) {
      alldihed[j] = -dot(N[0], N[i]); // Edge cd, bd, bc.
      if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
      else if (alldihed[j] > 1.0) alldihed[j] = 1;
      alldihed[j] = acos(alldihed[j]) / PI * 180.0;
      j++;
    }
    for (i = 2; i < 4; i++) {
      alldihed[j] = -dot(N[1], N[i]); // Edge ad, ac.
      if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
      else if (alldihed[j] > 1.0) alldihed[j] = 1;
      alldihed[j] = acos(alldihed[j]) / PI * 180.0;
      j++;
    }
    alldihed[j] = -dot(N[2], N[3]); // Edge ab.
    if (alldihed[j] < -1.0) alldihed[j] = -1; // Rounding.
    else if (alldihed[j] > 1.0) alldihed[j] = 1;
    alldihed[j] = acos(alldihed[j]) / PI * 180.0;

    // Calculate the largest and smallest dihedral angles.
    for (i = 0; i < 6; i++) {
      if (i == 0) {
        smalldiangle = bigdiangle = alldihed[i];
      } else {
        smalldiangle = alldihed[i] < smalldiangle ? alldihed[i] : smalldiangle;
        bigdiangle = alldihed[i] > bigdiangle ? alldihed[i] : bigdiangle;
      }
      if (alldihed[i] < smallestdiangle) {
        smallestdiangle = alldihed[i];
      } 
      if (alldihed[i] > biggestdiangle) {
        biggestdiangle = alldihed[i];
      }
      // Accumulate the corresponding number in the dihedral angle histogram.
      if (alldihed[i] < 5.0) {
        tendegree = 0;
      } else if (alldihed[i] >= 5.0 && alldihed[i] < 10.0) {
        tendegree = 1;
      } else if (alldihed[i] >= 80.0 && alldihed[i] < 110.0) {
        tendegree = 9; // Angles between 80 to 110 degree are in one entry.
      } else if (alldihed[i] >= 170.0 && alldihed[i] < 175.0) {
        tendegree = 16;
      } else if (alldihed[i] >= 175.0) {
        tendegree = 17;
      } else {
        tendegree = (int) (alldihed[i] / 10.);
        if (alldihed[i] < 80.0) {
          tendegree++;  // In the left column.
        } else {
          tendegree--;  // In the right column.
        }
      }
      dihedangletable[tendegree]++;
    }



    // Calculate the largest and smallest face angles.
    for (tetloop.ver = 0; tetloop.ver < 4; tetloop.ver++) {
      fsym(tetloop, neightet);
      // Only do the calulation once for a face.
      if (((point) neightet.tet[7] == dummypoint) || 
          (tetloop.tet < neightet.tet)) {
        p[0] = org(tetloop);
        p[1] = dest(tetloop);
        p[2] = apex(tetloop);
        faceangle[0] = interiorangle(p[0], p[1], p[2], NULL);
        faceangle[1] = interiorangle(p[1], p[2], p[0], NULL);
        faceangle[2] = PI - (faceangle[0] + faceangle[1]);
        // Translate angles into degrees.
        for (i = 0; i < 3; i++) {
          faceangle[i] = (faceangle[i] * 180.0) / PI;
        }
        // Calculate the largest and smallest face angles.
        for (i = 0; i < 3; i++) {
          if (i == 0) {
            smallfaangle = bigfaangle = faceangle[i];
          } else {
            smallfaangle = faceangle[i] < smallfaangle ? 
              faceangle[i] : smallfaangle;
            bigfaangle = faceangle[i] > bigfaangle ? faceangle[i] : bigfaangle;
          }
          if (faceangle[i] < smallestfaangle) {
            smallestfaangle = faceangle[i];
          } 
          if (faceangle[i] > biggestfaangle) {
            biggestfaangle = faceangle[i];
          }
          tendegree = (int) (faceangle[i] / 10.);
          faceangletable[tendegree]++;
        }
      }
    }

    // Calculate aspect ratio and radius-edge ratio for this element.
    tetradius = cirradius / sqrt(shortlen);
    // tetaspect = sqrt(longlen) / (2.0 * insradius);
    tetaspect = sqrt(longlen) * minheightinv;
    // Remember the largest and smallest aspect ratio.
    if (tetaspect < smallestratio) {
      smallestratio = tetaspect;
    } 
    if (tetaspect > biggestratio) {
      biggestratio = tetaspect;
    }
    // Accumulate the corresponding number in the aspect ratio histogram.
    aspectindex = 0;
    while ((tetaspect > aspectratiotable[aspectindex]) && (aspectindex < 11)) {
      aspectindex++;
    }
    aspecttable[aspectindex]++;
    radiusindex = 0;
    while ((tetradius > radiusratiotable[radiusindex]) && (radiusindex < 11)) {
      radiusindex++;
    }
    radiustable[radiusindex]++;

    tetloop.tet = tetrahedrontraverse();
  }

  shortest = sqrt(shortest);
  longest = sqrt(longest);
  minaltitude = sqrt(minaltitude);

  printf("  Smallest volume: %16.5g   |  Largest volume: %16.5g\n",
         smallestvolume, biggestvolume);
  printf("  Shortest edge:   %16.5g   |  Longest edge:   %16.5g\n",
         shortest, longest);
  printf("  Smallest asp.ratio: %13.5g   |  Largest asp.ratio: %13.5g\n",
         smallestratio, biggestratio);
  sprintf(sbuf, "%.17g", biggestfaangle);
  if (strlen(sbuf) > 8) {
    sbuf[8] = '\0';
  }
  printf("  Smallest facangle: %14.5g   |  Largest facangle:       %s\n",
         smallestfaangle, sbuf);
  sprintf(sbuf, "%.17g", biggestdiangle);
  if (strlen(sbuf) > 8) {
    sbuf[8] = '\0';
  }
  printf("  Smallest dihedral: %14.5g   |  Largest dihedral:       %s\n\n",
         smallestdiangle, sbuf);

  printf("  Aspect ratio histogram:\n");
  printf("         < %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
         aspectratiotable[0], aspecttable[0], aspectratiotable[5],
         aspectratiotable[6], aspecttable[6]);
  for (i = 1; i < 5; i++) {
    printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g - %-6.6g     :  %8ld\n",
           aspectratiotable[i - 1], aspectratiotable[i], aspecttable[i],
           aspectratiotable[i + 5], aspectratiotable[i + 6],
           aspecttable[i + 6]);
  }
  printf("  %6.6g - %-6.6g    :  %8ld      | %6.6g -            :  %8ld\n",
         aspectratiotable[4], aspectratiotable[5], aspecttable[5],
         aspectratiotable[10], aspecttable[11]);
  printf("  (A tetrahedron's aspect ratio is its longest edge length");
  printf(" divided by its\n");
  printf("    smallest side height)\n\n");

  printf("  Face angle histogram:\n");
  for (i = 0; i < 9; i++) {
    printf("    %3d - %3d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           i * 10, i * 10 + 10, faceangletable[i],
           i * 10 + 90, i * 10 + 100, faceangletable[i + 9]);
  }
  if (minfaceang != PI) {
    printf("  Minimum input face angle is %g (degree).\n",
           minfaceang / PI * 180.0);
  }
  printf("\n");

  printf("  Dihedral angle histogram:\n");
  // Print the three two rows:
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         0, 5, dihedangletable[0], 80, 110, dihedangletable[9]);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         5, 10, dihedangletable[1], 110, 120, dihedangletable[10]);
  // Print the third to seventh rows.
  for (i = 2; i < 7; i++) {
    printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
           (i - 1) * 10, (i - 1) * 10 + 10, dihedangletable[i],
           (i - 1) * 10 + 110, (i - 1) * 10 + 120, dihedangletable[i + 9]);
  }
  // Print the last two rows.
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         60, 70, dihedangletable[7], 170, 175, dihedangletable[16]);
  printf("     %3d - %2d degrees:  %8ld      |    %3d - %3d degrees:  %8ld\n",
         70, 80, dihedangletable[8], 175, 180, dihedangletable[17]);
  if (minfacetdihed != PI) {
    printf("  Minimum input dihedral angle is %g (degree).\n",
           minfacetdihed / PI * 180.0);
  }
  printf("\n");

  printf("\n");
}